

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void dynet::TensorTools::accumulate_dev<dynet::Device_CPU>(Device_CPU *dev,Tensor *v,Tensor *v_src)

{
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_48;
  DefaultDevice *local_38;
  undefined1 *local_30;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_28;
  
  local_28 = Tensor::tvec(v_src);
  local_48 = Tensor::tvec(v);
  local_38 = dev->edevice;
  local_30 = (undefined1 *)&local_48;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                *)&local_38,&local_28);
  return;
}

Assistant:

void TensorTools::accumulate_dev(const MyDevice & dev, Tensor& v, const Tensor& v_src) {
  DYNET_ASSERT(v.d.size() == v_src.d.size(), "TensorTools::accumulate can only be used with tensors of identical size");
  v.tvec().device(*dev.edevice) += v_src.tvec();
}